

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void init::LogPackageVersion(void)

{
  long lVar1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  string version_string;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FormatFullVersion_abi_cxx11_();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&version_string," (release build)");
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init/common.cpp";
  source_file._M_len = 0x58;
  logging_function._M_str = "LogPackageVersion";
  logging_function._M_len = 0x11;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function,source_file,0x95,
             IPC|I2P|VALIDATION|LIBEVENT|MEMPOOLREJ|PROXY|RAND|REINDEX|SELECTCOINS|ADDRMAN|WALLETDB|
             NET,(Level)&version_string,version_string._M_dataplus._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             version_string._M_string_length);
  std::__cxx11::string::~string((string *)&version_string);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LogPackageVersion()
{
    std::string version_string = FormatFullVersion();
#ifdef DEBUG
    version_string += " (debug build)";
#else
    version_string += " (release build)";
#endif
    LogPrintf(PACKAGE_NAME " version %s\n", version_string);
}